

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  float *pfVar5;
  undefined8 *puVar6;
  bool bVar7;
  long lVar8;
  float v;
  float fVar9;
  float fVar10;
  float local_3c [5];
  undefined1 local_28 [8];
  undefined8 uStack_20;
  int aiStack_18 [6];
  
  local_28 = (undefined1  [8])s_constInMat2;
  uStack_20 = DAT_0078b358;
  fVar1 = (evalCtx->coords).m_data[0];
  fVar2 = (evalCtx->coords).m_data[1];
  local_3c[1] = 0.0;
  local_3c[0] = 0.0;
  pfVar5 = local_3c + 1;
  puVar6 = (undefined8 *)local_28;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    fVar9 = 0.0;
    lVar8 = 0;
    fVar10 = fVar1;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      fVar9 = fVar9 + fVar10 * *(float *)(puVar6 + lVar8);
      lVar8 = 1;
      fVar10 = fVar2;
      bVar3 = false;
    } while (bVar7);
    *pfVar5 = fVar9;
    pfVar5 = local_3c;
    puVar6 = (undefined8 *)((long)local_28 + 4);
    bVar3 = false;
  } while (bVar4);
  local_3c[2] = local_3c[1];
  local_3c[3] = local_3c[0];
  local_3c[4] = local_3c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar8 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar8]] = local_3c[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}